

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O2

void __thiscall glcts::AdjacencyGrid::~AdjacencyGrid(AdjacencyGrid *this)

{
  ~AdjacencyGrid(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

AdjacencyGrid::~AdjacencyGrid()
{
	if (m_line_segments)
	{
		delete[] m_line_segments;
		m_line_segments = 0;
	}

	if (m_points)
	{
		delete[] m_points;
		m_points = 0;
	}

	if (m_triangles)
	{
		delete[] m_triangles;
		m_triangles = 0;
	}
}